

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeStringMeasure(TranslateToFuzzReader *this,Type type)

{
  Expression *ref;
  StringMeasure *pSVar1;
  
  if (type.id == 2) {
    ref = makeTrappingRefUse(this,(HeapType)0x50);
    pSVar1 = Builder::makeStringMeasure(&this->builder,StringMeasureWTF16,ref);
    return (Expression *)pSVar1;
  }
  __assert_fail("type == Type::i32",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0xeaa,"Expression *wasm::TranslateToFuzzReader::makeStringMeasure(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeStringMeasure(Type type) {
  assert(type == Type::i32);

  auto* ref = makeTrappingRefUse(HeapType::string);
  return builder.makeStringMeasure(StringMeasureWTF16, ref);
}